

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::mul(Vector *this,QMatrix *A,Vector *vec)

{
  pointer pfVar1;
  pointer pfVar2;
  int64_t iVar3;
  long i;
  real rVar4;
  
  iVar3 = QMatrix::getM(A);
  if (iVar3 != (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    __assert_fail("A.getM() == size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x5f,"void fasttext::Vector::mul(const QMatrix &, const Vector &)");
  }
  iVar3 = QMatrix::getN(A);
  if (iVar3 == (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar1 != pfVar2 && -1 < (long)pfVar1 - (long)pfVar2) {
      i = 0;
      do {
        rVar4 = QMatrix::dotRow(A,vec,i);
        pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar1[i] = rVar4;
        i = i + 1;
      } while (i < (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
    }
    return;
  }
  __assert_fail("A.getN() == vec.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,0x60,"void fasttext::Vector::mul(const QMatrix &, const Vector &)");
}

Assistant:

void Vector::mul(const QMatrix& A, const Vector& vec) {
  assert(A.getM() == size());
  assert(A.getN() == vec.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] = A.dotRow(vec, i);
  }
}